

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Spell.cpp
# Opt level: O2

void Handlers::Spell_Target_Other(Character *character,PacketReader *reader)

{
  byte bVar1;
  World *pWVar2;
  SpellTarget SVar3;
  uchar uVar4;
  bool bVar5;
  unsigned_short uVar6;
  uint uVar7;
  int iVar8;
  mapped_type *this;
  ESF_Data *pEVar9;
  int iVar10;
  int iVar11;
  allocator local_49;
  key_type local_48;
  
  uVar4 = PacketReader::GetChar(reader);
  PacketReader::GetChar(reader);
  PacketReader::GetShort(reader);
  PacketReader::GetShort(reader);
  uVar6 = PacketReader::GetShort(reader);
  uVar7 = PacketReader::GetThree(reader);
  iVar11 = (int)uVar7 % 0x83d600;
  if ((character->spell_event == (TimeEvent *)0x0) && (character->spell_ready != true)) {
    return;
  }
  if (uVar4 == '\x01') {
    SVar3 = TargetPlayer;
  }
  else {
    if (uVar4 != '\x02') {
      Character::CancelSpell(character);
      return;
    }
    SVar3 = TargetNPC;
  }
  character->spell_target = SVar3;
  character->spell_target_id = uVar6;
  pWVar2 = character->world;
  std::__cxx11::string::string((string *)&local_48,"EnforceTimestamps",&local_49);
  this = std::__detail::
         _Map_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_util::variant>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_util::variant>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
         ::operator[]((_Map_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_util::variant>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_util::variant>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                       *)&pWVar2->config,&local_48);
  bVar5 = util::variant::GetBool(this);
  std::__cxx11::string::~string((string *)&local_48);
  if (bVar5) {
    pEVar9 = ESF::Get(character->world->esf,(uint)character->spell_id);
    iVar8 = (character->timestamp).ts;
    iVar10 = iVar8;
    if ((iVar11 != -1) && (iVar10 = iVar11, iVar8 != -1)) {
      iVar10 = (iVar11 - iVar8) + 0x83d600;
      if (iVar8 <= iVar11) {
        iVar10 = iVar11 - iVar8;
      }
    }
    bVar1 = pEVar9->cast_time;
    if ((int)((uint)bVar1 * 0x2f + -0xc) <= iVar10) {
      iVar10 = iVar8;
      if ((iVar11 != -1) && (iVar10 = iVar11, iVar8 != -1)) {
        iVar10 = (iVar11 - iVar8) + 0x83d600;
        if (iVar8 <= iVar11) {
          iVar10 = iVar11 - iVar8;
        }
      }
      iVar8 = 0x32;
      if (bVar1 != 0) {
        iVar8 = (uint)bVar1 * 0x32;
      }
      if (iVar10 <= iVar8) goto LAB_001b6c18;
    }
    Character::CancelSpell(character);
  }
  else {
LAB_001b6c18:
    (character->timestamp).ts = iVar11;
    if (character->spell_ready == true) {
      Character::SpellAct(character);
    }
  }
  return;
}

Assistant:

void Spell_Target_Other(Character *character, PacketReader &reader)
	{
		unsigned char target_type = reader.GetChar();
		reader.GetChar();
		reader.GetShort();
		/*unsigned short spell_id = */ reader.GetShort();
		unsigned short victim_id = reader.GetShort();
		Timestamp timestamp = reader.GetThree();

		if (!character->spell_event && !character->spell_ready)
			return;

		switch (target_type)
		{
		case 1:
			character->spell_target = Character::TargetPlayer;
			character->spell_target_id = victim_id;
			break;

		case 2:
			character->spell_target = Character::TargetNPC;
			character->spell_target_id = victim_id;
			break;

		default:
			character->CancelSpell();
			return;
		}

		if (character->world->config["EnforceTimestamps"])
		{
			const ESF_Data &spell = character->world->esf->Get(character->spell_id);

			if (timestamp - character->timestamp < (spell.cast_time - 1) * 47 + 35 || timestamp - character->timestamp > std::max<int>(spell.cast_time, 1) * 50)
			{
				character->CancelSpell();
				return;
			}
		}

		character->timestamp = timestamp;

		if (character->spell_ready)
			character->SpellAct();
	}